

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.h
# Opt level: O0

double __thiscall
LocalBGValueFunctionVector::GetValue
          (LocalBGValueFunctionVector *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indPols)

{
  const_reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  
  IndexTools::IndividualToJointIndices
            (in_RDI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at(in_RSI,in_stack_ffffffffffffffd8);
  return *pvVar1;
}

Assistant:

double GetValue(std::vector<Index> indPols) const
        { return _m_values.at(
            IndexTools::IndividualToJointIndices(indPols, _m_nrIndivPols)
                ) ;}